

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphel.cpp
# Opt level: O1

void __thiscall
TPZGraphEl::TPZGraphEl
          (TPZGraphEl *this,void **vtt,TPZCompEl *cel,TPZGraphMesh *gmesh,TPZGraphNode **connectvec)

{
  long lVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  TPZConnect *connect;
  TPZAdmChunkVector<TPZGraphNode,_10> *pTVar4;
  TPZGraphNode *this_00;
  TPZAdmChunkVector<TPZGraphEl_*,_10> *pTVar5;
  TPZGraphEl **ppTVar6;
  ulong uVar7;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  this->fCompEl = cel;
  this->fGraphMesh = gmesh;
  this->fId = cel->fIndex;
  pTVar3 = TPZCompEl::Reference(cel);
  iVar2 = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3);
  if (0 < iVar2) {
    uVar7 = 0;
    do {
      connect = (TPZConnect *)(**(code **)(*(long *)cel + 0xa8))(cel,uVar7 & 0xffffffff);
      lVar1 = connect->fSequenceNumber;
      pTVar4 = TPZGraphMesh::NodeMap(gmesh);
      if ((pTVar4->super_TPZChunkVector<TPZGraphNode,_10>).fNElements <= lVar1) {
        pTVar4 = TPZGraphMesh::NodeMap(gmesh);
        TPZAdmChunkVector<TPZGraphNode,_10>::Resize(pTVar4,(int)lVar1 + 1);
      }
      pTVar4 = TPZGraphMesh::NodeMap(gmesh);
      this_00 = TPZChunkVector<TPZGraphNode,_10>::operator[]
                          (&pTVar4->super_TPZChunkVector<TPZGraphNode,_10>,connect->fSequenceNumber)
      ;
      if (this_00->fSequenceNumber == -1) {
        TPZGraphNode::SetElement(this_00,this);
        this_00->fSequenceNumber = connect->fSequenceNumber;
        TPZGraphNode::SetConnect(this_00,connect);
        TPZGraphNode::SetGraphMesh(this_00,gmesh);
      }
      connectvec[uVar7] = this_00;
      uVar7 = uVar7 + 1;
      pTVar3 = TPZCompEl::Reference(cel);
      iVar2 = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3);
    } while ((long)uVar7 < (long)iVar2);
  }
  pTVar5 = TPZGraphMesh::ElementList(gmesh);
  iVar2 = TPZAdmChunkVector<TPZGraphEl_*,_10>::AllocateNewElement(pTVar5);
  pTVar5 = TPZGraphMesh::ElementList(gmesh);
  ppTVar6 = TPZChunkVector<TPZGraphEl_*,_10>::operator[]
                      (&pTVar5->super_TPZChunkVector<TPZGraphEl_*,_10>,(long)iVar2);
  *ppTVar6 = this;
  return;
}

Assistant:

TPZGraphEl::TPZGraphEl(TPZCompEl *cel, TPZGraphMesh *gmesh, TPZGraphNode **connectvec)
{
	fCompEl = cel;
	fGraphMesh = gmesh;
	fId = cel->Index();
	TPZGraphNode *gno;
	for(int j = 0; j < cel->Reference()->NSides(); j++) {
		TPZConnect &cn = cel->Connect(j);
		int64_t newsize = cn.SequenceNumber()+1;
		if( gmesh->NodeMap().NElements() < newsize ) {
            gmesh->NodeMap().Resize(newsize);
		}
		gno = &gmesh->NodeMap()[cn.SequenceNumber()];
		if(gno->SequenceNumber() ==-1) {
			gno->SetElement(this);
			gno->SetSequenceNumber(cn.SequenceNumber());
			gno->SetConnect(&cn);
			gno->SetGraphMesh(gmesh);
		}
		connectvec[j] = gno;
	}
	int64_t index = gmesh->ElementList().AllocateNewElement();
	gmesh->ElementList()[index] = this;
}